

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getRuleSetName
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this,int32_t index)

{
  NFRuleSet *this_00;
  bool bVar1;
  bool bVar2;
  UBool UVar3;
  int iVar4;
  undefined4 extraout_var;
  NFRuleSet *rs;
  NFRuleSet **p;
  ConstChar16Ptr local_28;
  undefined1 local_1d;
  int32_t local_1c;
  RuleBasedNumberFormat *pRStack_18;
  int32_t index_local;
  RuleBasedNumberFormat *this_local;
  UnicodeString *empty;
  
  local_1c = index;
  pRStack_18 = this;
  this_local = (RuleBasedNumberFormat *)__return_storage_ptr__;
  if (this->localizations == (LocalizationInfo *)0x0) {
    if (this->fRuleSets != (NFRuleSet **)0x0) {
      bVar2 = false;
      UnicodeString::UnicodeString(__return_storage_ptr__);
      for (rs = (NFRuleSet *)this->fRuleSets; *(long *)rs != 0; rs = (NFRuleSet *)&rs->name) {
        this_00 = *(NFRuleSet **)rs;
        UVar3 = NFRuleSet::isPublic(this_00);
        if ((UVar3 != '\0') && (local_1c = local_1c + -1, local_1c == -1)) {
          NFRuleSet::getName(this_00,__return_storage_ptr__);
          bVar2 = true;
          bVar1 = true;
          goto LAB_00264bf7;
        }
      }
      bVar1 = false;
LAB_00264bf7:
      if (!bVar2) {
        UnicodeString::~UnicodeString(__return_storage_ptr__);
      }
      if (bVar1) {
        return __return_storage_ptr__;
      }
    }
    UnicodeString::UnicodeString(__return_storage_ptr__);
  }
  else {
    local_1d = 0;
    iVar4 = (*this->localizations->_vptr_LocalizationInfo[4])
                      (this->localizations,(ulong)(uint)index);
    ConstChar16Ptr::ConstChar16Ptr(&local_28,(char16_t *)CONCAT44(extraout_var,iVar4));
    UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_28,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
RuleBasedNumberFormat::getRuleSetName(int32_t index) const
{
    if (localizations) {
        UnicodeString string(TRUE, localizations->getRuleSetName(index), (int32_t)-1);
        return string;
    }
    else if (fRuleSets) {
        UnicodeString result;
        for (NFRuleSet** p = fRuleSets; *p; ++p) {
            NFRuleSet* rs = *p;
            if (rs->isPublic()) {
                if (--index == -1) {
                    rs->getName(result);
                    return result;
                }
            }
        }
    }
    UnicodeString empty;
    return empty;
}